

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

PortSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,bool *args_2)

{
  bool bVar1;
  SourceLocation SVar2;
  size_t sVar3;
  PortSymbol *pPVar4;
  
  pPVar4 = (PortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PortSymbol *)this->endPtr < pPVar4 + 1) {
    pPVar4 = (PortSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pPVar4 + 1);
  }
  sVar3 = strlen(*args);
  SVar2 = *args_1;
  bVar1 = *args_2;
  (pPVar4->super_Symbol).kind = Port;
  (pPVar4->super_Symbol).name._M_len = sVar3;
  (pPVar4->super_Symbol).name._M_str = *args;
  (pPVar4->super_Symbol).location = SVar2;
  (pPVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pPVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pPVar4->super_Symbol).indexInScope = 0;
  (pPVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pPVar4->internalSymbol = (Symbol *)0x0;
  pPVar4->direction = InOut;
  pPVar4->isNullPort = false;
  pPVar4->isAnsiPort = bVar1;
  pPVar4->type = (Type *)0x0;
  pPVar4->initializer = (Expression *)0x0;
  pPVar4->internalExpr = (Expression *)0x0;
  pPVar4->initializerSyntax = (ExpressionSyntax *)0x0;
  pPVar4->initializerLoc = (SourceLocation)0x0;
  pPVar4->externalLoc = SVar2;
  return pPVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }